

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O0

CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::operator>>(CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *val)

{
  bool bVar1;
  undefined8 in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff78;
  undefined1 local_78 [80];
  undefined8 local_28;
  undefined1 *local_10;
  undefined8 local_8;
  
  local_28 = in_RSI;
  while( true ) {
    if (*(int *)((long)(in_RDI->data)._M_elems + 0x10) <=
        *(int *)((long)(in_RDI->data)._M_elems + 0xc)) {
      *(bool *)((long)(in_RDI->data)._M_elems + 8) = true;
      return (CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)in_RDI;
    }
    bVar1 = IsInteger((char *)in_stack_ffffffffffffff78);
    if (bVar1) break;
    *(int *)((long)(in_RDI->data)._M_elems + 0xc) =
         *(int *)((long)(in_RDI->data)._M_elems + 0xc) + 1;
  }
  ReadInteger<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((char *)in_stack_ffffffffffffff78);
  local_8 = local_28;
  local_10 = local_78;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff78);
  *(int *)((long)(in_RDI->data)._M_elems + 0xc) = *(int *)((long)(in_RDI->data)._M_elems + 0xc) + 1;
  return (CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *)in_RDI;
}

Assistant:

CmdValueReader &operator>>(ValueType &val) override {
        while (pos < argc) {
            if (!IsInteger(argv[pos])) {
                ++pos;
                continue;
            }
            val = ReadInteger<ValueType>(argv[pos]);
            ++pos;
            return *this;
        }
        this->finished = true;
        return *this;
    }